

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O3

void Wln_WriteAddPos(Wln_Ntk_t *p)

{
  int iVar1;
  long lVar2;
  
  iVar1 = (p->vTypes).nSize;
  if (1 < iVar1) {
    lVar2 = 1;
    do {
      if ((p->vTypes).pArray[lVar2] - 5U < 0xfffffffe) {
        Wln_ObjCreateCo(p,(int)lVar2);
        iVar1 = (p->vTypes).nSize;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  return;
}

Assistant:

void Wln_WriteAddPos( Wln_Ntk_t * p )
{
    int iObj;
    Wln_NtkForEachObj( p, iObj )
        if ( !Wln_ObjIsCio(p, iObj) )
            Wln_ObjCreateCo( p, iObj );
}